

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

boolean could_advance(int skill)

{
  ushort uVar1;
  uint uVar2;
  bool local_e;
  bool local_d;
  int skill_local;
  
  local_d = false;
  if ((u.weapon_skills[skill].skill != '\0') &&
     (local_d = false, u.weapon_skills[skill].skill < u.weapon_skills[skill].max_skill)) {
    uVar1 = u.weapon_skills[skill].advance;
    uVar2 = practice_needed_to_advance(skill,(int)u.weapon_skills[skill].skill);
    local_e = uVar2 <= uVar1 && u.skills_advanced < 0x3c;
    local_d = local_e;
  }
  return local_d;
}

Assistant:

static boolean could_advance(int skill)
{
    return !P_RESTRICTED(skill)
	    && P_SKILL(skill) < P_MAX_SKILL(skill) && (
	    (P_ADVANCE(skill) >=
		(unsigned) practice_needed_to_advance(skill, P_SKILL(skill))
	    && u.skills_advanced < P_SKILL_LIMIT));
}